

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetMaskColor(ON_DimStyle *this,ON_Color color)

{
  ON_TextMask text_mask;
  
  text_mask.m_content_hash.m_digest._12_8_ =
       *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  text_mask.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  text_mask.m_mask_type = (this->m_text_mask).m_mask_type;
  text_mask.m_mask_frame = (this->m_text_mask).m_mask_frame;
  text_mask.m_reserved2 = (this->m_text_mask).m_reserved2;
  text_mask.m_mask_color.field_0 = (this->m_text_mask).m_mask_color.field_0;
  text_mask.m_mask_border = (this->m_text_mask).m_mask_border;
  text_mask.m_reserved3 = (this->m_text_mask).m_reserved3;
  text_mask.m_content_hash.m_digest[0] = (this->m_text_mask).m_content_hash.m_digest[0];
  text_mask.m_content_hash.m_digest[1] = (this->m_text_mask).m_content_hash.m_digest[1];
  text_mask.m_content_hash.m_digest[2] = (this->m_text_mask).m_content_hash.m_digest[2];
  text_mask.m_content_hash.m_digest[3] = (this->m_text_mask).m_content_hash.m_digest[3];
  text_mask.m_content_hash.m_digest._4_8_ =
       *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  ON_TextMask::SetMaskColor(&text_mask,color);
  Internal_SetTextMask(this,&text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskColor);
  return;
}

Assistant:

void ON_DimStyle::SetMaskColor(ON_Color color)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskColor(color);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskColor);
}